

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

void parse_ctl_line(char *line,char **path,uint32 *sf,uint32 *ef,char **id)

{
  uint32 uVar1;
  char *pcVar2;
  char local_1098 [8];
  char sv_line [4192];
  char *sp;
  char **id_local;
  uint32 *ef_local;
  uint32 *sf_local;
  char **path_local;
  char *line_local;
  
  strcpy(local_1098,line);
  sv_line._4184_8_ = strchr(local_1098,0x20);
  if ((char *)sv_line._4184_8_ == (char *)0x0) {
    if (path != (char **)0x0) {
      pcVar2 = strdup(local_1098);
      *path = pcVar2;
    }
    if (sf != (uint32 *)0x0) {
      *sf = 0xffffffff;
    }
    if (ef != (uint32 *)0x0) {
      *ef = 0xffffffff;
    }
    if (id != (char **)0x0) {
      *id = (char *)0x0;
    }
  }
  else {
    *(char *)sv_line._4184_8_ = '\0';
    if (path != (char **)0x0) {
      pcVar2 = strdup(local_1098);
      *path = pcVar2;
    }
    if (sf != (uint32 *)0x0) {
      uVar1 = atoi((char *)(sv_line._4184_8_ + 1));
      *sf = uVar1;
    }
    sv_line._4184_8_ = strchr((char *)(sv_line._4184_8_ + 1),0x20);
    if ((char *)sv_line._4184_8_ == (char *)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
              ,0x103,"Control file line must be \'<path> [<sf> <ef> [<id>]]\', instead saw \'%s\'\n"
              ,line);
      exit(1);
    }
    if (ef != (uint32 *)0x0) {
      uVar1 = atoi((char *)(sv_line._4184_8_ + 1));
      *ef = uVar1;
    }
    sv_line._4184_8_ = strchr((char *)(sv_line._4184_8_ + 1),0x20);
    if (id != (char **)0x0) {
      if ((char *)sv_line._4184_8_ == (char *)0x0) {
        *id = (char *)0x0;
      }
      else {
        pcVar2 = strdup((char *)(sv_line._4184_8_ + 1));
        *id = pcVar2;
      }
    }
  }
  return;
}

Assistant:

static void
parse_ctl_line(char *line,
	       char **path,
	       uint32 *sf,
	       uint32 *ef,
	       char **id)
{
    char *sp;
    char sv_line[4192];

    strcpy(sv_line, line);

    sp = strchr(sv_line, ' ');
    if (sp == NULL) {
	/* 'old' style control file */
	if (path)
	    *path = strdup(sv_line);
	if (sf)
	    *sf = NO_FRAME;
	if (ef)
	    *ef = NO_FRAME;
	if (id)
	    *id = NULL;
    }
    else {
	*sp = '\0';
	if (path)
	    *path = strdup(sv_line);
	
	/* at least one space, so try to parse rest of line */
	if (sf != NULL)
	    *sf = atoi(sp+1);	/* set the start frame */

	sp = strchr(sp+1, ' ');
	if (sp == NULL) {
	    E_FATAL("Control file line must be '<path> [<sf> <ef> [<id>]]', instead saw '%s'\n",
		    line);
	}

	if (ef != NULL)
	    *ef = atoi(sp+1);	/* set the end frame */

	sp = strchr(sp+1, ' ');
	if (id != NULL) {
	    if (sp == NULL) {
		/* assume that the optional ID has been omitted */
		*id = NULL;
	    }
	    else {
		*id = strdup(sp+1);	/* set the utterance ID */
	    }
	}
    }
}